

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

MPP_RET send_task(MppDevMppService *ctx)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  list_head *local_50;
  list_head *pos__;
  list_head *head__;
  MppDevBatServ *server;
  MppDevSession *session;
  MppDevTask *task;
  MppDevMppService *ctx_local;
  
  puVar2 = (undefined8 *)ctx->serv_ctx;
  if ((puVar2 == (undefined8 *)0x0) || (puVar2[8] == 0)) {
    _mpp_log_l(2,"mpp_server","invalid ctx %p session %p send task\n","send_task",ctx,puVar2);
    ctx_local._4_4_ = MPP_NOK;
  }
  else {
    puVar3 = (undefined8 *)puVar2[8];
    MppMutexCond::lock((MppMutexCond *)*puVar2);
    puVar4 = (undefined8 *)puVar2[5];
    if (puVar4 == puVar2 + 5) {
      local_50 = (list_head *)0x0;
    }
    else {
      local_50 = (list_head *)(puVar4 + -2);
    }
    if ((local_50 == (list_head *)0x0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"task","send_task",
                   0x1df), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    local_50[5].next = (list_head *)ctx->reqs;
    *(RK_S32 *)&local_50[5].prev = ctx->req_cnt;
    list_del_init(local_50 + 1);
    list_add_tail(local_50 + 1,(list_head *)(puVar2 + 3));
    *(int *)((long)puVar2 + 0x4c) = *(int *)((long)puVar2 + 0x4c) + 1;
    MppMutexCond::unlock((MppMutexCond *)*puVar2);
    Mutex::lock((Mutex *)*puVar3);
    iVar1 = *(int *)(puVar3 + 2);
    *(int *)(puVar3 + 2) = iVar1 + 1;
    *(int *)((long)&local_50[4].next + 4) = iVar1;
    list_del_init(local_50);
    list_add_tail(local_50,(list_head *)(puVar3 + 0xf));
    *(int *)(puVar3 + 0x11) = *(int *)(puVar3 + 0x11) + 1;
    if ((mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","session %d:%d add pending %d\n",(char *)0x0,
                 (ulong)*(uint *)(puVar2 + 9),(ulong)*(uint *)&local_50[4].next,
                 *(undefined4 *)(puVar3 + 0x11));
    }
    mpp_timer_set_enable((MppTimer)puVar3[3],1);
    Mutex::unlock((Mutex *)*puVar3);
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET send_task(MppDevMppService *ctx)
{
    MppDevTask *task = NULL;
    MppDevSession *session = (MppDevSession *)ctx->serv_ctx;

    if (NULL == session || NULL == session->server) {
        mpp_err_f("invalid ctx %p session %p send task\n", ctx, session);
        return MPP_NOK;
    }

    MppDevBatServ *server = session->server;

    /* get free task from session and add to run list */
    session->cond->lock();
    /* get a free task and setup */
    task = list_first_entry_or_null(&session->list_done, MppDevTask, link_session);
    mpp_assert(task);

    task->req = ctx->reqs;
    task->req_cnt = ctx->req_cnt;

    list_del_init(&task->link_session);
    list_add_tail(&task->link_session, &session->list_wait);

    session->task_wait++;
    session->cond->unlock();

    server->lock->lock();
    task->task_id = server->task_id++;
    list_del_init(&task->link_server);
    list_add_tail(&task->link_server, &server->pending_task);
    server->pending_count++;
    mpp_serv_dbg_flow("session %d:%d add pending %d\n",
                      session->client, task->slot_idx, server->pending_count);

    mpp_timer_set_enable(server->timer, 1);
    server->lock->unlock();

    return MPP_OK;
}